

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_print.c
# Opt level: O0

int table_print_level(void *cptr,mpt_identifier *id,mpt_convertable *conv,mpt_collection *sub)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  void *pvStack_68;
  int ret;
  print_context next;
  char *str_1;
  char *str;
  FILE *file;
  print_context *parent;
  print_context *ctx;
  mpt_collection *sub_local;
  mpt_convertable *conv_local;
  mpt_identifier *id_local;
  void *cptr_local;
  
  __stream = *(FILE **)((long)cptr + 8);
  parent = (print_context *)cptr;
  while (parent = parent->parent, parent != (print_context *)0x0) {
    fputc(0x2e,__stream);
  }
  if (id != (mpt_identifier *)0x0) {
    pcVar2 = (char *)mpt_identifier_data(id);
    fputs(pcVar2,__stream);
  }
  if (conv != (mpt_convertable *)0x0) {
    next.out = (FILE *)0x0;
    fputc(0x3d,__stream);
    iVar1 = (*conv->_vptr->convert)(conv,0x73,&next.out);
    if ((-1 < iVar1) && (next.out != (FILE *)0x0)) {
      fputs((char *)next.out,__stream);
    }
  }
  pcVar2 = (char *)mpt_newline_string(0);
  fputs(pcVar2,__stream);
  if ((sub == (mpt_collection *)0x0) ||
     (pvStack_68 = cptr, next.parent = (print_context *)__stream,
     cptr_local._4_4_ = (*sub->_vptr->each)(sub,table_print_level,&stack0xffffffffffffff98),
     -1 < cptr_local._4_4_)) {
    cptr_local._4_4_ = 0;
  }
  return cptr_local._4_4_;
}

Assistant:

extern int table_print_level(void *cptr, const MPT_STRUCT(identifier) *id, MPT_INTERFACE(convertable) *conv, const MPT_INTERFACE(collection) *sub)
{
	
	const struct print_context *ctx = cptr, *parent;
	FILE *file = ctx->out;
	
	/* print leading dots to indicate element depth */
	while ((parent = ctx->parent)) {
		fputc('.', file);
		ctx = parent;
	}
	
	/* current identifier and value */
	if (id) {
		const char *str = mpt_identifier_data(id);
		fputs(str, file);
	}
	if (conv) {
		const char *str = 0;
		fputc('=', file);
		if (conv->_vptr->convert(conv, 's', &str) >= 0 && str) {
			fputs(str, file);
		}
	}
	fputs(mpt_newline_string(0), file);
	
	/* process subtree with increased depth */
	if (sub) {
		struct print_context next = { cptr, file };
		int ret = sub->_vptr->each(sub, table_print_level, &next);
		
		if (ret < 0) {
			return ret;
		}
	}
	
	return 0;
}